

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQObject __thiscall SQFuncState::CreateString(SQFuncState *this,SQChar *s,SQInteger len)

{
  SQString *x;
  SQObjectPtr *in_RDI;
  SQObject SVar1;
  SQObjectPtr ns;
  SQChar *in_stack_ffffffffffffff98;
  SQSharedState *in_stack_ffffffffffffffa0;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffc8;
  
  x = SQString::Create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(SQInteger)in_RDI);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,x);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0,1);
  SQTable::NewSlot(in_stack_ffffffffffffffc8.pTable,in_stack_ffffffffffffffc0,
                   (SQObjectPtr *)in_stack_ffffffffffffffb8.pTable);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  SVar1._0_8_ = (ulong)in_stack_ffffffffffffffc0 & 0xffffffff;
  SVar1._unVal.pTable = in_stack_ffffffffffffffc8.pTable;
  return SVar1;
}

Assistant:

SQObject SQFuncState::CreateString(const SQChar *s,SQInteger len)
{
    SQObjectPtr ns(SQString::Create(_sharedstate,s,len));
    _table(_strings)->NewSlot(ns,(SQInteger)1);
    return ns;
}